

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepTiledOutputFile::setFrameBuffer(DeepTiledOutputFile *this,DeepFrameBuffer *frameBuffer)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  pthread_mutex_t *__mutex;
  Data *pDVar4;
  pointer ppTVar5;
  _Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
  *this_00;
  pointer ppTVar6;
  ChannelList *this_01;
  const_iterator cVar7;
  ConstIterator CVar8;
  ConstIterator CVar9;
  const_iterator cVar10;
  Slice *pSVar11;
  pointer ppTVar12;
  ArgExc *pAVar13;
  ostream *poVar14;
  char *pcVar15;
  size_t __n;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar16;
  size_t i;
  ulong uVar17;
  pointer ppTVar18;
  ulong __n_00;
  value_type local_1c0;
  vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
  slices;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  std::mutex::lock((mutex *)&__mutex->__data);
  this_01 = Header::channels(&this->_data->header);
  for (cVar7._M_node = (_Base_ptr)ChannelList::begin(this_01); CVar8 = ChannelList::end(this_01),
      (const_iterator)cVar7._M_node != CVar8._i._M_node;
      cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node)) {
    CVar9 = DeepFrameBuffer::find(frameBuffer,(char *)(cVar7._M_node + 1));
    cVar10._M_node = (_Base_ptr)DeepFrameBuffer::end(frameBuffer);
    if (CVar9._i._M_node != (const_iterator)cVar10._M_node) {
      if (cVar7._M_node[9]._M_color != *(_Rb_tree_color *)((long)CVar9._i._M_node + 0x120)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&slices);
        poVar14 = std::operator<<((ostream *)
                                  &slices.
                                   super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  "Pixel type of \"");
        poVar14 = std::operator<<(poVar14,(char *)(cVar7._M_node + 1));
        poVar14 = std::operator<<(poVar14,"\" channel of output file \"");
        pcVar15 = fileName(this);
        poVar14 = std::operator<<(poVar14,pcVar15);
        std::operator<<(poVar14,"\" is not compatible with the frame buffer\'s pixel type.");
        pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar13,(stringstream *)&slices);
        __cxa_throw(pAVar13,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      if ((*(int *)((long)CVar9._i._M_node + 0x140) != 1) ||
         (*(int *)((long)CVar9._i._M_node + 0x144) != 1)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&slices);
        std::operator<<((ostream *)
                        &slices.
                         super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        "All channels in a tiled file must havesampling (1,1).");
        pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar13,(stringstream *)&slices);
        __cxa_throw(pAVar13,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
    }
  }
  pSVar11 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  if (pSVar11->base == (char *)0x0) {
    pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar13,"Invalid base pointer, please set a proper sample count slice.")
    ;
    __cxa_throw(pAVar13,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  pDVar4 = this->_data;
  pDVar4->sampleCountSliceBase = pSVar11->base;
  sVar16 = pSVar11->yStride;
  pDVar4->sampleCountXStride = (int)pSVar11->xStride;
  pDVar4->sampleCountYStride = (int)sVar16;
  pDVar4->sampleCountXTileCoords = (uint)pSVar11->xTileCoords;
  pDVar4->sampleCountYTileCoords = (uint)pSVar11->yTileCoords;
  slices.
  super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  slices.
  super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  slices.
  super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar7._M_node = (_Base_ptr)ChannelList::begin(this_01);
  for (; CVar8 = ChannelList::end(this_01), (const_iterator)cVar7._M_node != CVar8._i._M_node;
      cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node)) {
    CVar9 = DeepFrameBuffer::find(frameBuffer,(char *)(cVar7._M_node + 1));
    cVar10._M_node = (_Base_ptr)DeepFrameBuffer::end(frameBuffer);
    if (CVar9._i._M_node == (const_iterator)cVar10._M_node) {
      local_1c0 = (value_type)operator_new(0x38);
      local_1c0->type = cVar7._M_node[9]._M_color;
      local_1c0->sampleStride = 0;
      local_1c0->xStride = 0;
      local_1c0->yStride = 0;
      local_1c0->zero = true;
      local_1c0->xTileCoords = 0;
      local_1c0->yTileCoords = 0;
      std::
      vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
      ::push_back(&slices,&local_1c0);
    }
    else {
      local_1c0 = (value_type)operator_new(0x38);
      iVar3 = *(int *)((long)CVar9._i._M_node + 0x154);
      bVar1 = *(byte *)((long)CVar9._i._M_node + 0x150);
      bVar2 = *(byte *)((long)CVar9._i._M_node + 0x151);
      local_1c0->type = *(PixelType *)((long)CVar9._i._M_node + 0x120);
      local_1c0->sampleStride = (long)iVar3;
      sVar16 = *(size_t *)((long)CVar9._i._M_node + 0x138);
      local_1c0->xStride = *(size_t *)((long)CVar9._i._M_node + 0x130);
      local_1c0->yStride = sVar16;
      local_1c0->zero = false;
      local_1c0->xTileCoords = (uint)bVar1;
      local_1c0->yTileCoords = (uint)bVar2;
      std::
      vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
      ::push_back(&slices,&local_1c0);
      slices.
      super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1]->base =
           *(char **)((long)CVar9._i._M_node + 0x128);
    }
  }
  DeepFrameBuffer::operator=(&this->_data->frameBuffer,frameBuffer);
  uVar17 = 0;
  while( true ) {
    pDVar4 = this->_data;
    ppTVar12 = (pDVar4->slices).
               super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppTVar5 = (pDVar4->slices).
              super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __n = (long)ppTVar5 - (long)ppTVar12;
    if ((ulong)((long)__n >> 3) <= uVar17) break;
    frameBuffer = (DeepFrameBuffer *)&DAT_00000038;
    operator_delete(ppTVar12[uVar17],0x38);
    uVar17 = uVar17 + 1;
  }
  ppTVar18 = slices.
             super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppTVar6 = slices.
            super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar17 = (long)slices.
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)slices.
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pDVar4->slices).
                    super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar12) < uVar17) {
    ppTVar12 = std::
               _Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
               ::_M_allocate((_Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                              *)((long)uVar17 >> 3),(size_t)frameBuffer);
    sVar16 = extraout_RDX;
    if (ppTVar6 != ppTVar18) {
      memcpy(ppTVar12,ppTVar18,uVar17);
      sVar16 = extraout_RDX_00;
    }
    this_00 = (_Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
               *)(pDVar4->slices).
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    std::
    _Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
    ::_M_deallocate(this_00,(pointer)((long)(pDVar4->slices).
                                            super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)this_00 >> 3),sVar16);
    (pDVar4->slices).
    super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppTVar12;
    (pDVar4->slices).
    super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)ppTVar12 + uVar17);
  }
  else {
    if (__n < uVar17) {
      if (ppTVar5 != ppTVar12) {
        memmove(ppTVar12,slices.
                         super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,__n);
        ppTVar5 = (pDVar4->slices).
                  super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)ppTVar5 -
              (long)(pDVar4->slices).
                    super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      }
      ppTVar12 = ppTVar5;
      ppTVar18 = (pointer)((long)ppTVar18 + __n);
      __n_00 = (long)ppTVar6 - (long)ppTVar18;
      if (__n_00 == 0) goto LAB_0016ef37;
    }
    else {
      __n_00 = uVar17;
      if (slices.
          super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          slices.
          super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_start) goto LAB_0016ef37;
    }
    memmove(ppTVar12,ppTVar18,__n_00);
  }
LAB_0016ef37:
  (pDVar4->slices).
  super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(uVar17 + (long)(pDVar4->slices).
                                super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
  ::~vector(&slices);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepTiledOutputFile::setFrameBuffer (const DeepFrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList& channels = _data->header.channels ();

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ()) continue;

        if (i.channel ().type != j.slice ().type)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Pixel type of \"" << i.name ()
                                   << "\" channel "
                                      "of output file \""
                                   << fileName ()
                                   << "\" is "
                                      "not compatible with the frame buffer's "
                                      "pixel type.");

        if (j.slice ().xSampling != 1 || j.slice ().ySampling != 1)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "All channels in a tiled file must have"
                "sampling (1,1).");
    }

    //
    // Store the pixel sample count table.
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice ();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = static_cast<int> (sampleCountSlice.xStride);
        _data->sampleCountYStride = static_cast<int> (sampleCountSlice.yStride);
        _data->sampleCountXTileCoords = sampleCountSlice.xTileCoords;
        _data->sampleCountYTileCoords = sampleCountSlice.yTileCoords;
    }

    //
    // Initialize slice table for writePixels().
    // Pixel sample count slice is not presented in the header,
    // so it wouldn't be added here.
    // Store the pixel base pointer table.
    //

    vector<TOutSliceInfo*> slices;

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ())
        {
            //
            // Channel i is not present in the frame buffer.
            // In the file, channel i will contain only zeroes.
            //

            slices.push_back (new TOutSliceInfo (
                i.channel ().type,
                0,      // sampleStride,
                0,      // xStride
                0,      // yStride
                true)); // zero
        }
        else
        {
            //
            // Channel i is present in the frame buffer.
            //

            slices.push_back (new TOutSliceInfo (
                j.slice ().type,
                j.slice ().sampleStride,
                j.slice ().xStride,
                j.slice ().yStride,
                false, // zero
                (j.slice ().xTileCoords) ? 1 : 0,
                (j.slice ().yTileCoords) ? 1 : 0));

            TOutSliceInfo* slice = slices.back ();
            slice->base          = j.slice ().base;
        }
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size (); i++)
        delete _data->slices[i];
    _data->slices = slices;
}